

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_ostream.hpp
# Opt level: O1

ostream_base * __thiscall
pstore::exchange::export_ns::ostream_base::write<_1l>(ostream_base *this,span<const_char,__1L> s)

{
  unsigned_long uVar1;
  ulong count;
  char *pcVar2;
  long offset;
  span<const_char,__1L> ss;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_70;
  span<const_char,__1L> local_60;
  span_iterator<pstore::gsl::span<const_char,__1L>,_false> local_50;
  span_iterator<pstore::gsl::span<const_char,__1L>,_false> local_40;
  
  local_60.storage_.data_ = s.storage_.data_;
  local_60.storage_.super_extent_type<_1L> = s.storage_.super_extent_type<_1L>.size_;
  if (local_60.storage_.super_extent_type<_1L>.size_ != 0) {
    uVar1 = unsigned_cast<long,unsigned_long,void>(local_60.storage_.super_extent_type<_1L>.size_);
    if (uVar1 != 0) {
      offset = 0;
      do {
        count = available_space(this);
        if (count == 0) {
          count = flush(this);
        }
        if (count == 0) {
          assert_failed("available > 0U",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/exchange/export_ostream.hpp"
                        ,0x9c);
        }
        if (uVar1 <= count) {
          count = uVar1;
        }
        if ((long)count < 0) {
          assert_failed("count <= unsigned_cast (std::numeric_limits<span_index_type>::max ())",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/exchange/export_ostream.hpp"
                        ,0xa2);
        }
        local_70 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
                   gsl::span<const_char,_-1L>::subspan(&local_60,offset,count);
        gsl::details::span_iterator<pstore::gsl::span<const_char,_-1L>,_false>::span_iterator
                  (&local_50,(span<const_char,__1L> *)&local_70,0);
        gsl::details::span_iterator<pstore::gsl::span<const_char,_-1L>,_false>::span_iterator
                  (&local_40,(span<const_char,__1L> *)&local_70,
                   local_70.super_extent_type<_1L>.size_);
        pcVar2 = std::
                 copy<pstore::gsl::details::span_iterator<pstore::gsl::span<char_const,_1l>,false>,char*>
                           (&local_50,&local_40,this->ptr_);
        this->ptr_ = pcVar2;
        if (this->end_ < pcVar2) {
          assert_failed("ptr_ <= end_",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/exchange/export_ostream.hpp"
                        ,0xa5);
        }
        offset = offset + count;
        uVar1 = uVar1 - count;
      } while (uVar1 != 0);
    }
  }
  return this;
}

Assistant:

ostream_base & ostream_base::write (gsl::span<char const, Extent> const s) {
                if (s.empty ()) {
                    return *this;
                }
                auto index = typename gsl::span<char const, Extent>::index_type{0};
                auto remaining = unsigned_cast (s.size ());
                while (remaining > 0U) {
                    // Flush the buffer if it is full.
                    auto available = this->available_space ();
                    if (available == 0U) {
                        available = this->flush ();
                    }
                    PSTORE_ASSERT (available > 0U);

                    // Copy as many characters as we can from the input span to the buffer.
                    auto const count = std::min (remaining, available);
                    using span_index_type = gsl::span<char const>::index_type;
                    PSTORE_ASSERT (count <=
                                   unsigned_cast (std::numeric_limits<span_index_type>::max ()));
                    auto ss = s.subspan (index, static_cast<span_index_type> (count));
                    ptr_ = std::copy (ss.begin (), ss.end (), ptr_);
                    PSTORE_ASSERT (ptr_ <= end_);

                    // Adjust our view of the characters remaining to be copied.
                    remaining -= count;
                    index += count;
                }
                return *this;
            }